

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcWindowAutoFitSize(ImGuiWindow_conflict *window,ImVec2 *size_contents)

{
  ImGuiPlatformMonitor *pIVar1;
  ImGuiContext_conflict1 *pIVar2;
  byte bVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  ImVec2 IVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImVec2 size_auto_fit;
  ImVec2 local_28;
  float local_20;
  float local_1c;
  
  pIVar2 = GImGui;
  fVar7 = ImGuiWindow::TitleBarHeight((ImGuiWindow *)window);
  fVar8 = ImGuiWindow::MenuBarHeight((ImGuiWindow *)window);
  local_20 = (window->WindowPadding).x;
  local_20 = local_20 + local_20;
  local_1c = (window->WindowPadding).y;
  local_1c = local_1c + local_1c;
  fVar15 = size_contents->x + local_20;
  fVar10 = size_contents->y + local_1c + fVar8 + fVar7;
  if (((uint)window->Flags >> 0x19 & 1) == 0) {
    IVar9 = (pIVar2->Style).WindowMinSize;
    if ((window->Flags & 0x14000000U) != 0) {
      fVar14 = IVar9.x;
      if (4.0 <= IVar9.x) {
        fVar14 = 4.0;
      }
      fVar13 = IVar9.y;
      if (4.0 <= IVar9.y) {
        fVar13 = 4.0;
      }
      IVar9.y = fVar13;
      IVar9.x = fVar14;
    }
    if (window->ViewportOwned == false) {
      fVar14 = (window->Viewport->super_ImGuiViewport).Size.x;
      fVar13 = (window->Viewport->super_ImGuiViewport).Size.y;
    }
    else {
      fVar14 = 3.4028235e+38;
      fVar13 = 3.4028235e+38;
    }
    lVar4 = (long)window->ViewportAllowPlatformMonitorExtend;
    if ((-1 < lVar4) &&
       (window->ViewportAllowPlatformMonitorExtend < (pIVar2->PlatformIO).Monitors.Size)) {
      pIVar1 = (pIVar2->PlatformIO).Monitors.Data;
      fVar14 = pIVar1[lVar4].WorkSize.x;
      fVar13 = pIVar1[lVar4].WorkSize.y;
    }
    fVar11 = (pIVar2->Style).DisplaySafeAreaPadding.x;
    fVar12 = (pIVar2->Style).DisplaySafeAreaPadding.y;
    fVar14 = fVar14 - (fVar11 + fVar11);
    fVar13 = fVar13 - (fVar12 + fVar12);
    fVar11 = IVar9.x;
    uVar6 = -(uint)(fVar14 <= fVar11);
    fVar12 = IVar9.y;
    fVar14 = (float)(uVar6 & (uint)fVar11 | ~uVar6 & (uint)fVar14);
    uVar6 = -(uint)(fVar13 <= fVar12);
    fVar13 = (float)(uVar6 & (uint)fVar12 | ~uVar6 & (uint)fVar13);
    if (fVar10 <= fVar13) {
      fVar13 = fVar10;
    }
    uVar6 = -(uint)(fVar14 < fVar15);
    local_28.x = (float)(-(uint)(fVar15 < fVar11) & (uint)fVar11 |
                        ~-(uint)(fVar15 < fVar11) &
                        (~uVar6 & (uint)(fVar15 + 0.0) | uVar6 & (uint)fVar14));
    local_28.y = (float)(-(uint)(fVar10 < fVar12) & (uint)fVar12 |
                        ~-(uint)(fVar10 < fVar12) & (uint)fVar13);
    IVar9 = CalcWindowSizeAfterConstraint(window,&local_28);
    if ((size_contents->x <= IVar9.x - local_20) || (bVar3 = 1, (window->Flags & 0x808U) != 0x800))
    {
      bVar3 = *(byte *)((long)&window->Flags + 1) >> 7;
    }
    if ((size_contents->y <= (IVar9.y - local_1c) - (fVar8 + fVar7)) ||
       (bVar5 = 1, (window->Flags & 8) != 0)) {
      bVar5 = (*(byte *)((long)&window->Flags + 1) & 0x40) >> 6;
    }
    if (bVar3 != 0) {
      local_28.y = (pIVar2->Style).ScrollbarSize + local_28.y;
    }
    if (bVar5 != 0) {
      local_28.x = (pIVar2->Style).ScrollbarSize + local_28.x;
    }
  }
  else {
    local_28.y = fVar10;
    local_28.x = fVar15 + 0.0;
  }
  return local_28;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    const float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + ImVec2(0.0f, decoration_up_height);
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));

        // FIXME-VIEWPORT-WORKAREA: May want to use GetWorkSize() instead of Size depending on the type of windows?
        ImVec2 avail_size = window->Viewport->Size;
        if (window->ViewportOwned)
            avail_size = ImVec2(FLT_MAX, FLT_MAX);
        const int monitor_idx = window->ViewportAllowPlatformMonitorExtend;
        if (monitor_idx >= 0 && monitor_idx < g.PlatformIO.Monitors.Size)
            avail_size = g.PlatformIO.Monitors[monitor_idx].WorkSize;
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, avail_size - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - 0.0f                 < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - decoration_up_height < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}